

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_stroke_polygon(nk_command_buffer *b,float *points,int point_count,float line_thickness,
                      nk_color col)

{
  void *pvVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  
  if (0xffffff < (uint)col && b != (nk_command_buffer *)0x0) {
    pvVar1 = nk_command_buffer_push(b,NK_COMMAND_POLYGON,(long)point_count * 4 + 0x20);
    if (pvVar1 != (void *)0x0) {
      *(short *)((long)pvVar1 + 0x10) = col._0_2_;
      *(nk_byte *)((long)pvVar1 + 0x12) = col.b;
      *(nk_byte *)((long)pvVar1 + 0x13) = col.a;
      *(short *)((long)pvVar1 + 0x14) = (short)(int)line_thickness;
      *(short *)((long)pvVar1 + 0x16) = (short)point_count;
      if (0 < point_count) {
        uVar2 = 0;
        do {
          auVar3._0_4_ = (int)(float)*(undefined8 *)(points + uVar2 * 2);
          auVar3._4_4_ = (int)(float)((ulong)*(undefined8 *)(points + uVar2 * 2) >> 0x20);
          auVar3._8_8_ = 0;
          auVar3 = pshuflw(auVar3,auVar3,0xe8);
          *(int *)((long)pvVar1 + uVar2 * 4 + 0x18) = auVar3._0_4_;
          uVar2 = uVar2 + 1;
        } while ((uint)point_count != uVar2);
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_polygon(struct nk_command_buffer *b,  float *points, int point_count,
    float line_thickness, struct nk_color col)
{
    int i;
    nk_size size = 0;
    struct nk_command_polygon *cmd;

    NK_ASSERT(b);
    if (!b || col.a == 0) return;
    size = sizeof(*cmd) + sizeof(short) * 2 * (nk_size)point_count;
    cmd = (struct nk_command_polygon*) nk_command_buffer_push(b, NK_COMMAND_POLYGON, size);
    if (!cmd) return;
    cmd->color = col;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->point_count = (unsigned short)point_count;
    for (i = 0; i < point_count; ++i) {
        cmd->points[i].x = (short)points[i*2];
        cmd->points[i].y = (short)points[i*2+1];
    }
}